

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

int __thiscall smf::MidiFile::linkNotePairsFIFO(MidiFile *this)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  for (lVar4 = 0;
      ppMVar1 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
      lVar4 = lVar4 + 1) {
    this_00 = ppMVar1[lVar4];
    if (this_00 != (MidiEventList *)0x0) {
      iVar2 = MidiEventList::linkNotePairsFIFO(this_00);
      iVar3 = iVar3 + iVar2;
    }
  }
  this->m_linkedEventsQ = true;
  return iVar3;
}

Assistant:

int MidiFile::linkNotePairsFIFO(void) {
	int i;
	int sum = 0;
	for (i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		sum += m_events[i]->linkNotePairsFIFO();
	}
	m_linkedEventsQ = true;
	return sum;
}